

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O1

void __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::set_bitset_table
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,range_pairs *fcc)

{
  ulong *puVar1;
  uchar21 uVar2;
  pointer prVar3;
  Type *pTVar4;
  uchar21 uVar5;
  ulong uVar6;
  uchar21 uVar7;
  bool bVar8;
  
  if ((fcc->rparray_).size_ != 0) {
    prVar3 = (fcc->rparray_).buffer_;
    pTVar4 = (this->super_re_object_core<char,_srell::u8regex_traits<char>_>).firstchar_class_bs.
             buffer_;
    uVar6 = 0;
    do {
      uVar7 = prVar3[uVar6].first;
      if ((uint)uVar7 < 0x110000) {
        uVar2 = prVar3[uVar6].second;
        do {
          uVar5 = uVar7;
          if (0x7f < (uint)uVar7) {
            if ((uint)uVar7 < 0x800) {
              uVar5 = (uint)uVar7 >> 6 | 0xc0;
            }
            else if ((uint)uVar7 < 0x10000) {
              uVar5 = (uint)uVar7 >> 0xc | 0xe0;
            }
            else {
              uVar5 = (uint)uVar7 >> 0x12 | 0xf0;
            }
          }
          puVar1 = (ulong *)((long)pTVar4 + (ulong)((uint)uVar5 >> 3 & 0x18));
          *puVar1 = *puVar1 | (long)(1 << ((byte)uVar5 & 0x1f));
        } while ((uVar2 != uVar7) &&
                (bVar8 = (uint)uVar7 < 0x10ffff, uVar7 = uVar7 + L'\x01', bVar8));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (fcc->rparray_).size_);
  }
  return;
}

Assistant:

void set_bitset_table(const range_pairs &fcc)
	{
		for (typename range_pairs::size_type i = 0; i < fcc.size(); ++i)
		{
			const range_pair &range = fcc[i];

			for (uchar21 ucp = range.first; ucp <= constants::unicode_max_codepoint; ++ucp)
			{
				this->firstchar_class_bs.set(utf_traits::firstcodeunit(ucp) & utf_traits::bitsetmask);

				if (ucp == range.second)
					break;
			}
		}
	}